

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

method_base * __thiscall
cs::translator_type::match
          (translator_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  element_type *peVar4;
  undefined8 in_RSI;
  shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>
  *it;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  *__range2;
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  stack;
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  *in_stack_fffffffffffffec8;
  compile_error *in_stack_fffffffffffffed0;
  method_base *pmVar5;
  token_base *in_stack_fffffffffffffed8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffee0;
  allocator *paVar6;
  allocator local_d9;
  string local_d8 [16];
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  *in_stack_ffffffffffffff38;
  anon_class_8_1_ba1d7388 in_stack_ffffffffffffff40;
  allocator local_b1;
  string local_b0 [32];
  undefined8 local_90;
  undefined8 local_88;
  reference local_80;
  _Self local_78;
  _Self local_70 [2];
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  local_60;
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  sVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x13e511);
  if (sVar2 < 2) {
    local_45 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Empty input when matching grammar.",&local_31);
    compile_error::compile_error(in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
    local_45 = 0;
    __cxa_throw(uVar3,&compile_error::typeinfo,compile_error::~compile_error);
  }
  std::__cxx11::
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  ::list((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
          *)0x13e602);
  local_70[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
       ::begin(in_stack_fffffffffffffec8);
  local_78._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
       ::end(in_stack_fffffffffffffec8);
  while (bVar1 = std::operator!=(local_70,&local_78), bVar1) {
    local_80 = std::
               _List_iterator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>
               ::operator*((_List_iterator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>
                            *)in_stack_fffffffffffffed0);
    std::
    __shared_ptr_access<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x13e679);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::front
              (in_stack_fffffffffffffee0);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::front
              (in_stack_fffffffffffffee0);
    bVar1 = compare(in_stack_fffffffffffffed8,(token_base *)in_stack_fffffffffffffed0);
    if (bVar1) {
      std::__cxx11::
      list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
      ::push_back((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                   *)in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    }
    std::
    _List_iterator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>
    ::operator++(local_70);
  }
  local_88 = local_10;
  std::__cxx11::
  list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
  ::
  remove_if<cs::translator_type::match(std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&)::_lambda(std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>const&)_1_>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  local_90 = local_10;
  std::__cxx11::
  list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
  ::
  remove_if<cs::translator_type::match(std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&)::_lambda(std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>const&)_2_>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  bVar1 = std::__cxx11::
          list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
          ::empty(&local_60);
  if (bVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Unknown grammar.",&local_b1);
    compile_error::compile_error(in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
    __cxa_throw(uVar3,&compile_error::typeinfo,compile_error::~compile_error);
  }
  sVar2 = std::__cxx11::
          list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
          ::size((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                  *)in_stack_fffffffffffffed0);
  if (sVar2 < 2) {
    std::__cxx11::
    list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
    ::front((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
             *)in_stack_fffffffffffffed0);
    peVar4 = std::
             __shared_ptr_access<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13e922);
    pmVar5 = peVar4->second;
    std::__cxx11::
    list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
    ::~list((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
             *)0x13e938);
    return pmVar5;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  paVar6 = &local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Ambiguous grammar.",paVar6);
  compile_error::compile_error(in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
  __cxa_throw(uVar3,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

method_base *match(const std::deque<token_base *> &raw)
		{
			if (raw.size() <= 1)
				throw compile_error("Empty input when matching grammar.");
			std::list<std::shared_ptr<data_type>> stack;
			for (auto &it: m_data)
				if (cs::translator_type::compare(it->first.front(), raw.front()))
					stack.push_back(it);
			stack.remove_if([&](const std::shared_ptr<data_type> &dat) {
				return dat->first.size() != raw.size();
			});
			stack.remove_if([&](const std::shared_ptr<data_type> &dat) {
				for (std::size_t i = 1; i < raw.size() - 1; ++i) {
					if (!compare(raw.at(i), dat->first.at(i)))
						return true;
				}
				return false;
			});
			if (stack.empty())
				throw compile_error("Unknown grammar.");
			if (stack.size() > 1)
				throw compile_error("Ambiguous grammar.");
			return stack.front()->second;
		}